

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O2

Am_Value __thiscall Am_Enum_Support::From_String(Am_Enum_Support *this,char *string)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  char *pcVar4;
  ulong uVar5;
  Am_Value AVar6;
  
  lVar1 = *(long *)(string + 0x10);
  uVar5 = 0;
  if (0 < (int)*(uint *)(string + 0x18)) {
    uVar5 = (ulong)*(uint *)(string + 0x18);
  }
  pcVar4 = (char *)0xffffffffffffffff;
  do {
    if ((long)pcVar4 - uVar5 == -1) {
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      aVar3 = extraout_RDX_00;
      goto LAB_002276a5;
    }
    iVar2 = strcmp(in_RDX,*(char **)(lVar1 + 8 + (long)pcVar4 * 8));
    pcVar4 = pcVar4 + 1;
  } while (iVar2 != 0);
  *(undefined2 *)&(this->super_Am_Type_Support)._vptr_Am_Type_Support =
       *(undefined2 *)(string + 0x1c);
  this->value_string = pcVar4;
  aVar3 = extraout_RDX;
LAB_002276a5:
  AVar6.value.wrapper_value = aVar3.wrapper_value;
  AVar6._0_8_ = this;
  return AVar6;
}

Assistant:

Am_Value
Am_Enum_Support::From_String(const char *string) const
{
  int i;
  for (i = 0; i < number; ++i) {
    if (!strcmp(string, item[i]))
      return Am_Value(i, type);
  }
  return Am_No_Value;
}